

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

long duckdb::DecimalScaleUpCheckOperator::Operation<duckdb::hugeint_t,long>
               (hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  hugeint_t input_00;
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  uint8_t in_R9B;
  hugeint_t value;
  string error;
  allocator local_b1;
  hugeint_t local_b0;
  hugeint_t local_a0;
  string local_80;
  string local_60;
  string local_40 [32];
  
  local_b0.upper = input.upper;
  local_b0.lower = input.lower;
  bVar1 = hugeint_t::operator>=(&local_b0,(hugeint_t *)((long)dataptr + 0x20));
  if (!bVar1) {
    local_a0 = hugeint_t::operator-((hugeint_t *)((long)dataptr + 0x20));
    bVar1 = hugeint_t::operator<=(&local_b0,&local_a0);
    if (!bVar1) {
      input_00.upper = local_b0.upper;
      input_00.lower = local_b0.lower;
      lVar2 = Cast::Operation<duckdb::hugeint_t,long>(input_00);
      return lVar2 * *(long *)((long)dataptr + 0x30);
    }
  }
  ::std::__cxx11::string::string
            (local_40,"Casting value \"%s\" to type %s failed: value is out of range!",&local_b1);
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)*(byte *)((long)dataptr + 0x39);
  value.upper._0_1_ = *(undefined1 *)((long)dataptr + 0x38);
  value.lower = local_b0.upper;
  value.upper._1_7_ = 0;
  Decimal::ToString_abi_cxx11_
            (&local_60,(Decimal *)local_b0.lower,value,*(byte *)((long)dataptr + 0x39),in_R9B);
  LogicalType::ToString_abi_cxx11_(&local_80,(LogicalType *)(*dataptr + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            ((string *)&local_a0,(StringUtil *)local_40,&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,params_1
            );
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string(local_40);
  lVar2 = HandleVectorCastError::Operation<long>
                    ((string *)&local_a0,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
  ::std::__cxx11::string::~string((string *)&local_a0);
  return lVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}